

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O1

string * __thiscall
cmExtraSublimeTextGenerator::ComputeIncludes_abi_cxx11_
          (string *__return_storage_ptr__,cmExtraSublimeTextGenerator *this,cmSourceFile *source,
          cmLocalGenerator *lg,cmGeneratorTarget *target)

{
  cmMakefile *this_00;
  pointer pcVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  string *lang;
  string *config;
  cmValue cVar3;
  string *psVar4;
  string INCLUDE_DIRECTORIES;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  string *includesString;
  cmGeneratorExpressionInterpreter genexInterpreter;
  string local_148;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_128;
  string local_108;
  string *local_e8;
  string local_e0;
  string local_c0;
  cmGeneratorExpressionInterpreter local_a0;
  
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = lg->Makefile;
  local_e8 = __return_storage_ptr__;
  lang = cmSourceFile::GetOrDetermineLanguage_abi_cxx11_(source);
  p_Var2 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&local_a0.GeneratorExpression.Backtrace + 8);
  local_a0.GeneratorExpression.CMakeInstance = (cmake *)p_Var2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"CMAKE_BUILD_TYPE","");
  config = cmMakefile::GetSafeDefinition(this_00,(string *)&local_a0);
  if (local_a0.GeneratorExpression.CMakeInstance != (cmake *)p_Var2) {
    operator_delete(local_a0.GeneratorExpression.CMakeInstance,
                    (ulong)((long)&(local_a0.GeneratorExpression.Backtrace.
                                    super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                                    TopEntry.
                                    super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  pcVar1 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_108,pcVar1,pcVar1 + config->_M_string_length);
  pcVar1 = (lang->_M_dataplus)._M_p;
  local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c0,pcVar1,pcVar1 + lang->_M_string_length);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            (&local_a0,lg,&local_108,target,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"INCLUDE_DIRECTORIES","");
  cVar3 = cmSourceFile::GetProperty(source,&local_148);
  if (cVar3.Value != (string *)0x0) {
    pcVar1 = ((cVar3.Value)->_M_dataplus)._M_p;
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar1,pcVar1 + (cVar3.Value)->_M_string_length);
    psVar4 = cmGeneratorExpressionInterpreter::Evaluate(&local_a0,&local_e0,&local_148);
    cmLocalGenerator::AppendIncludeDirectories(lg,&local_128,psVar4,source);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
  }
  cmLocalGenerator::GetIncludeDirectories(lg,&local_128,target,lang,config);
  psVar4 = local_e8;
  cmLocalGenerator::GetIncludeFlags(local_e8,lg,&local_128,target,lang,config,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.Language._M_dataplus._M_p != &local_a0.Language.field_2) {
    operator_delete(local_a0.Language._M_dataplus._M_p,
                    local_a0.Language.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.Config._M_dataplus._M_p != &local_a0.Config.field_2) {
    operator_delete(local_a0.Config._M_dataplus._M_p,
                    local_a0.Config.field_2._M_allocated_capacity + 1);
  }
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr(&local_a0.CompiledGeneratorExpression);
  cmGeneratorExpression::~cmGeneratorExpression(&local_a0.GeneratorExpression);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_128);
  return psVar4;
}

Assistant:

std::string cmExtraSublimeTextGenerator::ComputeIncludes(
  cmSourceFile* source, cmLocalGenerator* lg, cmGeneratorTarget* target)

{
  std::vector<std::string> includes;
  cmMakefile* makefile = lg->GetMakefile();
  const std::string& language = source->GetOrDetermineLanguage();
  const std::string& config = makefile->GetSafeDefinition("CMAKE_BUILD_TYPE");
  cmGeneratorExpressionInterpreter genexInterpreter(lg, config, target,
                                                    language);

  // Add include directories for this source file
  const std::string INCLUDE_DIRECTORIES("INCLUDE_DIRECTORIES");
  if (cmValue cincludes = source->GetProperty(INCLUDE_DIRECTORIES)) {
    lg->AppendIncludeDirectories(
      includes, genexInterpreter.Evaluate(*cincludes, INCLUDE_DIRECTORIES),
      *source);
  }

  // Add include directory flags.
  lg->GetIncludeDirectories(includes, target, language, config);

  std::string includesString =
    lg->GetIncludeFlags(includes, target, language, config, false);

  return includesString;
}